

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O1

int file_time_adjust_epsilon(char *filename,int direction)

{
  __time_t _Var1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  stat sb;
  stat local_c0;
  
  iVar3 = stat(filename,&local_c0);
  lVar2 = local_c0.st_mtim.tv_nsec;
  _Var1 = local_c0.st_mtim.tv_sec;
  if (iVar3 != -1) {
    uVar4 = direction >> 0x1f | 1;
    dVar8 = (double)(int)uVar4;
    lVar5 = 5;
    bVar7 = false;
    do {
      iVar3 = file_time_adjust_relative(filename,file_time_adjust_epsilon::epsilons[lVar5] * dVar8);
      if ((iVar3 == 0) && (iVar3 = stat(filename,&local_c0), iVar3 != -1)) {
        bVar6 = false;
        if (_Var1 == local_c0.st_mtim.tv_sec) {
          bVar6 = lVar2 == local_c0.st_mtim.tv_nsec;
          if (!bVar6) {
            uVar4 = 0;
          }
        }
        else {
          uVar4 = 0;
        }
      }
      else {
        bVar6 = false;
        uVar4 = 0xffffffff;
      }
      if (!bVar6) break;
      bVar7 = lVar5 == 0;
      bVar6 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while (bVar6);
    if (!bVar7) {
      return uVar4;
    }
    file_time_adjust_epsilon();
  }
  return -1;
}

Assistant:

static int file_time_adjust_epsilon(const char* filename, int direction) {
  struct timespec previous_timestamp;
  if (get_file_mtime(filename, &previous_timestamp) == -1) {
    return -1;
  }

  // Attempt differently sized ULPs for different filesystems.
  // What do we know about the file systems' modify time resolutions:
  //  FAT: 2 seconds
  //  HFS, ext3: 1 second
  //  ext4: 1 millisecond
  //  NTFS: 100 nanoseconds
  //  APFS: nanosecond
  static double epsilons[] = {2, 1, 0.001, 0.000001, 0.0000001, 0.000000001};

  // Try to adjust several times with increasingly growing epsilon
  // and see if adjustments results in a material change.
  for (int i = sizeof(epsilons) / sizeof(epsilons[0]) - 1; i >= 0; i--) {
    double e = epsilons[i] * ((direction < 0) ? -1 : 1);
    if (file_time_adjust_relative(filename, e)) {
      return -1;
    }
    struct timespec new_timestamp;
    if (get_file_mtime(filename, &new_timestamp) == -1) {
      return -1;
    }
    if (new_timestamp.tv_sec != previous_timestamp.tv_sec
     || new_timestamp.tv_nsec != previous_timestamp.tv_nsec) {
      return 0;
    }
  }

  fprintf(stderr, "%s: Can't adjust time to %+.9g\n", filename, epsilons[0]);
  errno = ERANGE;
  return -1;
}